

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATrie.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  if (argc != 2) {
    fprintf(_stderr,"Must specify mode, got %d args\n",(ulong)(uint)argc);
    exit(2);
  }
  iVar1 = strcmp(argv[1],"test");
  if (iVar1 == 0) {
    TestObject::clear(&gTester);
    testDNANodeInsert();
    testDNANodeFind();
    testDNATrieLeftShift();
    TestObject::finish(&gTester);
  }
  return 0;
}

Assistant:

int main(int argc, char const* argv[])
{
	if (argc != 2) {
		std::fprintf(stderr, "Must specify mode, got %d args\n", argc);
		std::exit(2);
	}
    if (std::strcmp(argv[1], "test") == 0) {
        gTester.clear();
        testDNANodeInsert();
        testDNANodeFind();
        testDNATrieLeftShift();
        gTester.finish();
    }
    return 0;
}